

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::replace(QString *this,QString *before,QLatin1StringView after,CaseSensitivity cs)

{
  long lVar1;
  QLatin1StringView str;
  qsizetype blen;
  qsizetype qVar2;
  undefined8 in_RCX;
  QString *in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype alen;
  QVarLengthArray<char16_t,_256LL> a;
  QLatin1String *in_stack_fffffffffffffd38;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  QLatin1Char ch;
  undefined1 *__s;
  char *in_stack_fffffffffffffd68;
  CaseSensitivity in_stack_fffffffffffffd7c;
  qsizetype in_stack_fffffffffffffd80;
  undefined5 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8d;
  undefined2 in_stack_fffffffffffffd8e;
  undefined4 in_stack_fffffffffffffd98;
  QString *local_250;
  CaseSensitivity cs_00;
  QString *in_stack_fffffffffffffde0;
  QChar in_stack_fffffffffffffe1c;
  QChar in_stack_fffffffffffffe1e;
  
  cs_00 = (CaseSensitivity)((ulong)in_RCX >> 0x20);
  ch.ch = (char)((ulong)in_stack_fffffffffffffd48 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blen = QLatin1String::size((QLatin1String *)&stack0xfffffffffffffdd0);
  qVar2 = size(in_RSI);
  if ((qVar2 == 1) && (blen == 1)) {
    front((QString *)in_stack_fffffffffffffd38);
    QLatin1String::front(in_stack_fffffffffffffd38);
    QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffffd40,ch);
    local_250 = replace(in_stack_fffffffffffffde0,in_stack_fffffffffffffe1e,
                        in_stack_fffffffffffffe1c,cs_00);
  }
  else {
    __s = &stack0xfffffffffffffde0;
    memset(__s,0xaa,0x218);
    str.m_data = in_stack_fffffffffffffd68;
    str.m_size = (qsizetype)__s;
    qt_from_latin1_to_qvla(str);
    constData((QString *)0x50d549);
    QVLABase<char16_t>::data((QVLABase<char16_t> *)&stack0xfffffffffffffde0);
    local_250 = replace(in_RSI,(QChar *)CONCAT44(in_R8D,in_stack_fffffffffffffd98),blen,
                        (QChar *)CONCAT26(in_stack_fffffffffffffd8e,
                                          CONCAT15(in_stack_fffffffffffffd8d,
                                                   in_stack_fffffffffffffd88)),
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_250;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(const QString &before, QLatin1StringView after, Qt::CaseSensitivity cs)
{
    const qsizetype alen = after.size();
    if (before.size() == 1 && alen == 1)
        return replace(before.front(), after.front(), cs);

    QVarLengthArray<char16_t> a = qt_from_latin1_to_qvla(after);
    return replace(before.constData(), before.d.size, (const QChar *)a.data(), alen, cs);
}